

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * QPDF::recover_encryption_key_with_password
                   (string *__return_storage_ptr__,string *password,EncryptionData *data,
                   bool *perms_valid)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  void *__s1;
  uchar local_1b8 [8];
  uchar k [16];
  undefined1 local_1a0 [8];
  string perms_check;
  undefined1 local_178 [8];
  string intermediate_key;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [48];
  undefined1 local_a8 [8];
  string encrypted_file_key;
  string user_data;
  string key_salt;
  string key_password;
  bool *perms_valid_local;
  EncryptionData *data_local;
  string *password_local;
  string *file_key;
  
  *perms_valid = false;
  psVar3 = (string *)((long)&key_salt.field_2 + 8);
  truncate_password_V5(psVar3,password);
  std::__cxx11::string::string((string *)(user_data.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(encrypted_file_key.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_a8);
  bVar1 = check_owner_password_V5(psVar3,data);
  if (bVar1) {
    psVar3 = EncryptionData::getO_abi_cxx11_(data);
    std::__cxx11::string::substr((ulong)local_d8,(ulong)psVar3);
    std::__cxx11::string::operator=((string *)(user_data.field_2._M_local_buf + 8),local_d8);
    std::__cxx11::string::~string(local_d8);
    psVar3 = EncryptionData::getU_abi_cxx11_(data);
    std::__cxx11::string::substr((ulong)local_f8,(ulong)psVar3);
    std::__cxx11::string::operator=
              ((string *)(encrypted_file_key.field_2._M_local_buf + 8),local_f8);
    std::__cxx11::string::~string(local_f8);
    psVar3 = EncryptionData::getOE_abi_cxx11_(data);
    std::__cxx11::string::substr((ulong)local_118,(ulong)psVar3);
    std::__cxx11::string::operator=((string *)local_a8,local_118);
    std::__cxx11::string::~string(local_118);
  }
  else {
    bVar1 = check_user_password_V5((string *)((long)&key_salt.field_2 + 8),data);
    if (bVar1) {
      psVar3 = EncryptionData::getU_abi_cxx11_(data);
      std::__cxx11::string::substr((ulong)local_138,(ulong)psVar3);
      std::__cxx11::string::operator=((string *)(user_data.field_2._M_local_buf + 8),local_138);
      std::__cxx11::string::~string(local_138);
      psVar3 = EncryptionData::getUE_abi_cxx11_(data);
      std::__cxx11::string::substr((ulong)((long)&intermediate_key.field_2 + 8),(ulong)psVar3);
      std::__cxx11::string::operator=
                ((string *)local_a8,(string *)(intermediate_key.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(intermediate_key.field_2._M_local_buf + 8));
    }
  }
  hash_V5((string *)local_178,(string *)((long)&key_salt.field_2 + 8),
          (string *)((long)&user_data.field_2 + 8),(string *)((long)&encrypted_file_key.field_2 + 8)
          ,data);
  perms_check.field_2._M_local_buf[0xf] = '\0';
  process_with_aes(__return_storage_ptr__,(string *)local_178,false,(string *)local_a8,0,1,
                   (uchar *)0x0,0);
  psVar3 = EncryptionData::getPerms_abi_cxx11_(data);
  process_with_aes((string *)local_1a0,__return_storage_ptr__,false,psVar3,0xc,1,(uchar *)0x0,0);
  compute_Perms_value_V5_clear(__return_storage_ptr__,data,local_1b8);
  __s1 = (void *)std::__cxx11::string::c_str();
  iVar2 = memcmp(__s1,local_1b8,0xc);
  *perms_valid = iVar2 == 0;
  perms_check.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_1a0);
  if ((perms_check.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(encrypted_file_key.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(user_data.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(key_salt.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::recover_encryption_key_with_password(
    std::string const& password, EncryptionData const& data, bool& perms_valid)
{
    // Algorithm 3.2a from the PDF 1.7 extension level 3

    // This code does not handle Unicode passwords correctly. Empirical evidence suggests that most
    // viewers don't.  We are supposed to process the input string with the SASLprep (RFC 4013)
    // profile of stringprep (RFC 3454) and then convert the result to UTF-8.

    perms_valid = false;
    std::string key_password = truncate_password_V5(password);
    std::string key_salt;
    std::string user_data;
    std::string encrypted_file_key;
    if (check_owner_password_V5(key_password, data)) {
        key_salt = data.getO().substr(40, 8);
        user_data = data.getU().substr(0, 48);
        encrypted_file_key = data.getOE().substr(0, 32);
    } else if (check_user_password_V5(key_password, data)) {
        key_salt = data.getU().substr(40, 8);
        encrypted_file_key = data.getUE().substr(0, 32);
    }
    std::string intermediate_key = hash_V5(key_password, key_salt, user_data, data);
    std::string file_key = process_with_aes(intermediate_key, false, encrypted_file_key);

    // Decrypt Perms and check against expected value
    std::string perms_check = process_with_aes(file_key, false, data.getPerms(), 12);
    unsigned char k[16];
    compute_Perms_value_V5_clear(file_key, data, k);
    perms_valid = (memcmp(perms_check.c_str(), k, 12) == 0);

    return file_key;
}